

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_pathops.cc
# Opt level: O2

string * ctemplate::PathJoin(string *__return_storage_ptr__,string *a,string *b)

{
  string *psVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  psVar1 = a;
  if (((b->_M_string_length == 0) || (psVar1 = b, a->_M_string_length == 0)) ||
     (*(b->_M_dataplus)._M_p == '/')) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar1);
  }
  else if ((a->_M_dataplus)._M_p[a->_M_string_length - 1] == '/') {
    std::operator+(__return_storage_ptr__,a,b);
  }
  else {
    std::operator+(&bStack_38,a,'/');
    std::operator+(__return_storage_ptr__,&bStack_38,b);
    std::__cxx11::string::~string((string *)&bStack_38);
  }
  return __return_storage_ptr__;
}

Assistant:

string PathJoin(const string& a, const string& b) {
  if (b.empty()) return a;                        // degenerate case 1
  if (a.empty()) return b;                        // degenerate case 2
  if (IsAbspath(b)) return b;                     // absolute path
  if (IsDirectory(a)) return a + b;               // 'well-formed' case
  return a + PATH_SEP + b;
}